

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.c
# Opt level: O2

int mbedtls_chacha20_self_test(int verbose)

{
  size_t data_len;
  int iVar1;
  ulong uVar2;
  uchar (*__s2) [375];
  size_t *psVar3;
  uchar (*local_1d8) [375];
  uint32_t *local_1d0;
  uchar (*local_1c8) [12];
  uchar (*local_1c0) [32];
  uchar output [381];
  
  local_1c0 = test_keys;
  local_1c8 = test_nonces;
  local_1d0 = test_counters;
  psVar3 = test_lengths;
  local_1d8 = test_input;
  __s2 = test_output;
  uVar2 = 0;
  while( true ) {
    if (uVar2 == 2) {
      if (verbose != 0) {
        putchar(10);
      }
      return 0;
    }
    if (verbose != 0) {
      printf("  ChaCha20 test %u ",uVar2 & 0xffffffff);
    }
    data_len = *psVar3;
    mbedtls_chacha20_crypt(*local_1c0,*local_1c8,*local_1d0,data_len,*local_1d8,output);
    iVar1 = bcmp(output,__s2,data_len);
    if (iVar1 != 0) break;
    if (verbose != 0) {
      puts("passed");
    }
    uVar2 = uVar2 + 1;
    local_1c0 = local_1c0 + 1;
    local_1c8 = local_1c8 + 1;
    local_1d0 = local_1d0 + 1;
    psVar3 = psVar3 + 1;
    local_1d8 = local_1d8 + 1;
    __s2 = __s2 + 1;
  }
  if (verbose == 0) {
    return -1;
  }
  puts("failed (output)");
  return -1;
}

Assistant:

int mbedtls_chacha20_self_test( int verbose )
{
    unsigned char output[381];
    unsigned i;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    for( i = 0U; i < 2U; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  ChaCha20 test %u ", i );

        ret = mbedtls_chacha20_crypt( test_keys[i],
                                      test_nonces[i],
                                      test_counters[i],
                                      test_lengths[i],
                                      test_input[i],
                                      output );

        ASSERT( 0 == ret, ( "error code: %i\n", ret ) );

        ASSERT( 0 == memcmp( output, test_output[i], test_lengths[i] ),
                ( "failed (output)\n" ) );

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}